

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 26.hpp
# Opt level: O2

void std::
     __relocate_object_a<njoy::ENDFtk::section::Type<26>,njoy::ENDFtk::section::Type<26>,std::allocator<njoy::ENDFtk::section::Type<26>>>
               (Type<26> *__dest,Type<26> *__orig,
               allocator<njoy::ENDFtk::section::Type<26>_> *__alloc)

{
  double dVar1;
  pointer pRVar2;
  undefined4 uVar3;
  
  uVar3 = *(undefined4 *)&(__orig->super_Base).field_0x14;
  (__dest->super_Base).MT_ = (__orig->super_Base).MT_;
  *(undefined4 *)&(__dest->super_Base).field_0x14 = uVar3;
  uVar3 = *(undefined4 *)
           &(__orig->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4;
  dVar1 = (__orig->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  (__dest->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_ =
       (__orig->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  *(undefined4 *)&(__dest->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4 =
       uVar3;
  (__dest->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_ = dVar1;
  pRVar2 = (__orig->products_).
           super__Vector_base<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__dest->products_).
  super__Vector_base<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__orig->products_).
       super__Vector_base<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__dest->products_).
  super__Vector_base<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar2;
  (__dest->products_).
  super__Vector_base<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__orig->products_).
       super__Vector_base<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__orig->products_).
  super__Vector_base<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__orig->products_).
  super__Vector_base<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__orig->products_).
  super__Vector_base<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vector<njoy::ENDFtk::section::Type<26>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<26>::ReactionProduct>_>
  ::~vector(&__orig->products_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 26 > : protected Base {

    #include "ENDFtk/section/6/src/verifySorted.hpp"

  public:

    #include "ENDFtk/section/26/Multiplicity.hpp"

    #include "ENDFtk/section/26/ContinuumEnergyAngle.hpp"      // LAW=1
    #include "ENDFtk/section/26/DiscreteTwoBodyScattering.hpp" // LAW=2
    #include "ENDFtk/section/26/EnergyTransfer.hpp"            // LAW=8

    using LAW1 = ContinuumEnergyAngle;
    using LAW2 = DiscreteTwoBodyScattering;
    using LAW8 = EnergyTransfer;

    using Distribution = std::variant< ContinuumEnergyAngle,      // LAW=1
                                       DiscreteTwoBodyScattering, // LAW=2
                                       EnergyTransfer >;          // LAW=8

    #include "ENDFtk/section/26/ReactionProduct.hpp"

  private:

    /* fields */
    std::vector< ReactionProduct > products_;

    /* auxiliary functions */

  public:

    /* constructor */
    #include "ENDFtk/section/26/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the number of reaction products
     */
    int NK() const { return this->products_.size(); }

    /**
     *  @brief Return the number of reaction products
     */
    int numberReactionProducts() const { return this->NK(); }

    /**
     *  @brief Return whether or not the reaction product is present
     *
     *  @param[in] zap    the reaction product to retrieve
     */
    bool hasReactionProduct( int zap ) const {

      return std::find_if( this->products_.begin(), this->products_.end(),
                           [zap] ( auto&& product )
                                 { return product.productIdentifier() == zap; } )
             != this->products_.end();
    }

    /**
     *  @brief Return the requested reaction product
     *
     *  @param[in] zap    the reaction product to retrieve
     */
    const ReactionProduct& reactionProduct( int zap ) const {

      auto iter = std::find_if( this->products_.begin(), this->products_.end(),
                                [zap] ( auto&& product )
                                      { return product.productIdentifier() == zap; } );
      if ( this->products_.end() == iter ) {

        Log::error( "The requested reaction product {} is not present in MF26", zap );
        throw std::exception();
      }
      else {

        return *iter;
      }
    }

    /**
     *  @brief Return the reaction products defined in this section
     */
    auto reactionProducts() const {

      return ranges::cpp20::views::all( this->products_ );
    }

    #include "ENDFtk/section/26/src/NC.hpp"
    #include "ENDFtk/section/26/src/print.hpp"

    using Base::MT;
    using Base::sectionNumber;
    using Base::ZA;
    using Base::targetIdentifier;
    using Base::atomicWeightRatio;
    using Base::AWR;
  }